

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O3

FrameBuffer * __thiscall Imf_2_5::InputFile::frameBuffer(InputFile *this)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  int iVar2;
  FrameBuffer *pFVar3;
  
  __mutex = (pthread_mutex_t *)this->_data;
  if ((CompositeDeepScanLine *)__mutex[5].__align != (CompositeDeepScanLine *)0x0) {
    pFVar3 = CompositeDeepScanLine::frameBuffer((CompositeDeepScanLine *)__mutex[5].__align);
    return pFVar3;
  }
  if (*(char *)((long)__mutex + 100) == '\x01') {
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 == 0) {
      pDVar1 = this->_data;
      pthread_mutex_unlock(__mutex);
      return &pDVar1->tFileBuffer;
    }
    std::__throw_system_error(iVar2);
  }
  pFVar3 = ScanLineInputFile::frameBuffer(*(ScanLineInputFile **)((long)__mutex + 0x70));
  return pFVar3;
}

Assistant:

const FrameBuffer &
InputFile::frameBuffer () const
{
    if(_data->compositor)
    {
        return _data->compositor->frameBuffer();
    }
    else if(_data->isTiled)
    {
	Lock lock (*_data);
	return _data->tFileBuffer;
    }
    else
    {
	return _data->sFile->frameBuffer();
    }
}